

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::doEncodeString(JsonGenerator *this,string *s)

{
  byte *__buf;
  bool bVar1;
  locale *__loc;
  byte *in_RCX;
  void *in_RDX;
  void *__buf_00;
  char *p;
  byte *p_00;
  byte __c;
  size_type sVar2;
  byte *b;
  
  p_00 = (byte *)(s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  __buf = p_00 + sVar2;
  StreamWriter::write(&this->out_,0x22,in_RDX,(size_t)in_RCX);
  b = p_00;
  do {
    if (sVar2 == 0) {
      write(this,(int)b,__buf,(size_t)in_RCX);
      StreamWriter::write(&this->out_,0x22,__buf_00,(size_t)in_RCX);
      return;
    }
    __c = *p_00;
    in_RCX = (byte *)(ulong)(__c - 8);
    switch(in_RCX) {
    case (byte *)0x0:
      __c = 0x62;
      break;
    case (byte *)0x1:
      __c = 0x74;
      break;
    case (byte *)0x2:
      __c = 0x6e;
      break;
    case (byte *)0x3:
switchD_001b3c8d_caseD_b:
      __loc = (locale *)std::locale::classic();
      bVar1 = std::iscntrl<char>(__c,__loc);
      if (bVar1) {
        write(this,(int)b,p_00,(size_t)in_RCX);
        escapeCtl(this,*p_00);
        goto LAB_001b3d0c;
      }
      goto LAB_001b3d10;
    case (byte *)0x4:
      __c = 0x66;
      break;
    case (byte *)0x5:
      __c = 0x72;
      break;
    default:
      if ((0x3a < __c - 0x22) ||
         (in_RCX = (byte *)0x400000000002001,
         (0x400000000002001U >> ((ulong)(__c - 0x22) & 0x3f) & 1) == 0))
      goto switchD_001b3c8d_caseD_b;
    }
    in_RCX = p_00;
    escape(this,__c,(char *)b,(char *)p_00);
LAB_001b3d0c:
    b = p_00 + 1;
LAB_001b3d10:
    p_00 = p_00 + 1;
    sVar2 = sVar2 - 1;
  } while( true );
}

Assistant:

void doEncodeString(const std::string& s) {
        const char* b = &s[0];
        const char* e = b + s.size();
        out_.write('"');
        for (const char* p = b; p != e; p++) {
            switch (*p) {
            case '\\':
            case '"':
            case '/':
                escape(*p, b, p);
                break;
            case '\b':
                escape('b', b, p);
                break;
            case '\f':
                escape('f', b, p);
                break;
            case '\n':
                escape('n', b, p);
                break;
            case '\r':
                escape('r', b, p);
                break;
            case '\t':
                escape('t', b, p);
                break;
            default:
                if (! std::iscntrl(*p, std::locale::classic())) {
                    continue;
                }
                write(b, p);
                escapeCtl(*p);
                break;
            }
            b = p + 1;
        }
        write(b, e);
        out_.write('"');
    }